

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Gia_Man_t * Gia_ManFormulaUnfold(Gia_Man_t *p,char *pForm,int fFfOnly)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  bool bVar7;
  int local_140;
  int local_e8;
  int local_e4;
  int nPars;
  int nVars;
  int iFans [2];
  int iCtrl [8];
  int local_b0;
  int local_ac;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  char local_88 [4];
  int Count;
  char pStr [100];
  int fFfOnly_local;
  char *pForm_local;
  Gia_Man_t *p_local;
  
  pNew._4_4_ = 0;
  sVar4 = strlen(pForm);
  if (99 < sVar4) {
    __assert_fail("strlen(pForm) < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrCount(pForm,&local_e4,&local_e8);
  if (local_e4 != 2) {
    __assert_fail("nVars == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34f,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrTransform(local_88,pForm);
  Gia_ManPrintFormula(local_88);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1 * 5);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  local_ac = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (local_ac < iVar1) {
      _k = Gia_ManCi(p,local_ac);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _k->Value = uVar2;
    local_ac = local_ac + 1;
  }
  if (fFfOnly == 0) {
    local_ac = 0;
    while( true ) {
      bVar7 = false;
      if (local_ac < p->nObjs) {
        _k = Gia_ManObj(p,local_ac);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        for (local_b0 = 0; local_b0 < local_e8; local_b0 = local_b0 + 1) {
          iVar1 = Gia_ManAppendCi(p_00);
          iFans[local_b0] = iVar1;
        }
        nPars = Gia_ObjFanin0Copy(_k);
        nVars = Gia_ObjFanin1Copy(_k);
        uVar2 = Gia_ManRealizeFormula(p_00,&nPars,iFans,local_88,local_e8);
        _k->Value = uVar2;
      }
      local_ac = local_ac + 1;
    }
  }
  else {
    Gia_ManCleanMark0(p);
    local_ac = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar7 = false;
      if (local_ac < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar1 + local_ac);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(_k);
      *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffbfffffff | 0x40000000;
      local_ac = local_ac + 1;
    }
    local_ac = 0;
    while( true ) {
      bVar7 = false;
      if (local_ac < p->nObjs) {
        _k = Gia_ManObj(p,local_ac);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        if ((*(ulong *)_k >> 0x1e & 1) == 0) {
          iVar1 = Gia_ObjFanin0Copy(_k);
          iVar3 = Gia_ObjFanin1Copy(_k);
          uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
          _k->Value = uVar2;
        }
        else {
          for (local_b0 = 0; local_b0 < local_e8; local_b0 = local_b0 + 1) {
            iVar1 = Gia_ManAppendCi(p_00);
            iFans[local_b0] = iVar1;
          }
          nPars = Gia_ObjFanin0Copy(_k);
          nVars = Gia_ObjFanin1Copy(_k);
          uVar2 = Gia_ManRealizeFormula(p_00,&nPars,iFans,local_88,local_e8);
          _k->Value = uVar2;
          pNew._4_4_ = pNew._4_4_ + 1;
        }
      }
      local_ac = local_ac + 1;
    }
    local_ac = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar7 = false;
      if (local_ac < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar1 + local_ac);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(_k);
      *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffbfffffff;
      local_ac = local_ac + 1;
    }
  }
  local_ac = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (local_ac < iVar1) {
      _k = Gia_ManCo(p,local_ac);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(_k);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    _k->Value = uVar2;
    local_ac = local_ac + 1;
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar1 = Gia_ManPiNum(p_01);
  iVar3 = Gia_ManCiNum(p);
  if (fFfOnly == 0) {
    local_140 = Gia_ManAndNum(p);
  }
  else {
    local_140 = pNew._4_4_;
  }
  if (iVar1 != iVar3 + local_e8 * local_140) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x37d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManFormulaUnfold( Gia_Man_t * p, char * pForm, int fFfOnly )
{
    char pStr[100];
    int Count = 0;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, k, iCtrl[FFTEST_MAX_PARS], iFans[FFTEST_MAX_VARS];
    int nVars, nPars;
    assert( strlen(pForm) < 100 );
    Gia_FormStrCount( pForm, &nVars, &nPars );
    assert( nVars == 2 );
    Gia_FormStrTransform( pStr, pForm );
    Gia_ManPrintFormula( pStr );
    pNew = Gia_ManStart( 5 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManCleanMark0( p );
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( pObj->fMark0 )
            {
                for ( k = 0; k < nPars; k++ )
                    iCtrl[k] = Gia_ManAppendCi(pNew);
                iFans[0] = Gia_ObjFanin0Copy(pObj);
                iFans[1] = Gia_ObjFanin1Copy(pObj);
                pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
                Count++;
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 0;
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            for ( k = 0; k < nPars; k++ )
                iCtrl[k] = Gia_ManAppendCi(pNew);
            iFans[0] = Gia_ObjFanin0Copy(pObj);
            iFans[1] = Gia_ObjFanin1Copy(pObj);
            pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p)) );
//    if ( fUseFaults )
//        Gia_AigerWrite( pNew, "newfault.aig", 0, 0, 0 );
    return pNew;
}